

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int trex_element(TRex *exp)

{
  char *pcVar1;
  byte *pbVar2;
  TRexNode *pTVar3;
  int c_1;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ushort **ppuVar10;
  char **ppcVar11;
  byte bVar12;
  char *pcVar13;
  char cVar14;
  TRexNodeType TVar15;
  int c;
  int iVar16;
  
  pbVar2 = (byte *)exp->_p;
  bVar12 = *pbVar2;
  if (0x2d < bVar12) {
    if (bVar12 == 0x2e) {
      exp->_p = (char *)(pbVar2 + 1);
      TVar15 = 0x104;
      goto LAB_00126d1c;
    }
    if (bVar12 != 0x5b) goto LAB_00126cf0;
    exp->_p = (char *)(pbVar2 + 1);
    if (pbVar2[1] == 0x5e) {
      iVar4 = trex_newnode(exp,0x107);
      pcVar13 = exp->_p + 1;
      exp->_p = pcVar13;
    }
    else {
      iVar4 = trex_newnode(exp,0x105);
      pcVar13 = exp->_p;
    }
    cVar14 = *pcVar13;
    if (cVar14 != ']') {
      iVar16 = -1;
      iVar5 = iVar4;
      do {
        iVar7 = iVar16;
        if (pcVar13 == exp->_eol) break;
        if (iVar16 == -1 || cVar14 != '-') {
          if (iVar16 == -1) {
            iVar7 = trex_charnode(exp,1);
          }
          else {
            exp->_nodes[iVar5].next = iVar16;
            iVar7 = trex_charnode(exp,1);
            iVar5 = iVar16;
          }
        }
        else {
          exp->_p = pcVar13 + 1;
          if (*pcVar13 == ']') {
            ppcVar11 = exp->_error;
            if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
            pcVar13 = "unfinished range";
            goto LAB_001270c7;
          }
          iVar6 = trex_newnode(exp,0x108);
          pcVar13 = exp->_p;
          if (*pcVar13 < iVar16) {
            ppcVar11 = exp->_error;
            if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
            pcVar13 = "invalid range";
            goto LAB_001270c7;
          }
          pTVar3 = exp->_nodes;
          if (pTVar3[iVar16].type == 0x106) {
            ppcVar11 = exp->_error;
            if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
            pcVar13 = "cannot use character classes in ranges";
            goto LAB_001270c7;
          }
          pTVar3[iVar6].left = pTVar3[iVar16].type;
          cVar14 = *pcVar13;
          if ((long)cVar14 == 0x5c) {
            pcVar1 = pcVar13 + 1;
            exp->_p = pcVar1;
            uVar9 = (int)pcVar13[1] - 0x66U >> 1;
            uVar8 = uVar9 | (uint)(((int)pcVar13[1] - 0x66U & 1) != 0) << 0x1f;
            exp->_p = pcVar13 + 2;
            pcVar13 = pcVar1;
            if ((uVar8 < 9) && ((0x1d1U >> (uVar9 & 0x1f) & 1) != 0)) {
              pcVar13 = &DAT_0013f528 + uVar8;
            }
          }
          else {
            ppuVar10 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar10 + (long)cVar14 * 2 + 1) & 0x40) == 0) {
              ppcVar11 = exp->_error;
              if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
              pcVar13 = "letter expected";
              goto LAB_001270c7;
            }
            exp->_p = pcVar13 + 1;
          }
          pTVar3[iVar6].right = (int)*pcVar13;
          pTVar3[iVar5].next = iVar6;
          iVar7 = -1;
          iVar5 = iVar6;
        }
        pcVar13 = exp->_p;
        cVar14 = *pcVar13;
        iVar16 = iVar7;
      } while (cVar14 != ']');
      pTVar3 = exp->_nodes;
      if (iVar7 != -1) {
        pTVar3[iVar5].next = iVar7;
      }
      pTVar3[iVar4].left = pTVar3[iVar4].next;
      pTVar3[iVar4].next = -1;
      iVar5 = 0x5d;
      goto LAB_00126edf;
    }
    ppcVar11 = exp->_error;
    if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
    pcVar13 = "empty class";
    goto LAB_001270c7;
  }
  if (bVar12 == 0x24) {
    exp->_p = (char *)(pbVar2 + 1);
    TVar15 = 0x10a;
LAB_00126d1c:
    iVar4 = trex_newnode(exp,TVar15);
  }
  else if (bVar12 == 0x28) {
    exp->_p = (char *)(pbVar2 + 1);
    TVar15 = 0x102;
    if (pbVar2[1] == 0x3f) {
      exp->_p = (char *)(pbVar2 + 2);
      trex_expect(exp,0x3a);
      TVar15 = 0x103;
    }
    iVar4 = trex_newnode(exp,TVar15);
    iVar5 = trex_list(exp);
    exp->_nodes[iVar4].left = iVar5;
    iVar5 = 0x29;
LAB_00126edf:
    trex_expect(exp,iVar5);
  }
  else {
LAB_00126cf0:
    iVar4 = trex_charnode(exp,0);
  }
  pbVar2 = (byte *)exp->_p;
  bVar12 = *pbVar2;
  if (bVar12 < 0x3f) {
    if (bVar12 == 0x2a) {
      exp->_p = (char *)(pbVar2 + 1);
      uVar9 = 0xffff;
LAB_00126f8f:
      uVar8 = 0;
    }
    else {
      if (bVar12 != 0x2b) goto LAB_00126ffd;
      exp->_p = (char *)(pbVar2 + 1);
      uVar9 = 0xffff;
      uVar8 = 0x10000;
    }
  }
  else {
    if (bVar12 == 0x3f) {
      exp->_p = (char *)(pbVar2 + 1);
      uVar9 = 1;
      goto LAB_00126f8f;
    }
    if (bVar12 != 0x7b) goto LAB_00126ffd;
    exp->_p = (char *)(pbVar2 + 1);
    ppuVar10 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar10 + (long)(char)pbVar2[1] * 2 + 1) & 8) == 0) {
      ppcVar11 = exp->_error;
      if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
      pcVar13 = "number expected";
LAB_001270c7:
      *ppcVar11 = pcVar13;
LAB_001270ca:
      longjmp((__jmp_buf_tag *)exp->_jmpbuf,-1);
    }
    uVar8 = trex_parsenumber(exp);
    pcVar13 = exp->_p;
    if (*pcVar13 == ',') {
      exp->_p = pcVar13 + 1;
      uVar9 = 0xffff;
      if ((*(byte *)((long)*ppuVar10 + (long)pcVar13[1] * 2 + 1) & 8) != 0) {
        uVar9 = trex_parsenumber(exp);
      }
      trex_expect(exp,0x7d);
    }
    else {
      if (*pcVar13 != '}') {
        ppcVar11 = exp->_error;
        if (ppcVar11 == (char **)0x0) goto LAB_001270ca;
        pcVar13 = ", or } expected";
        goto LAB_001270c7;
      }
      exp->_p = pcVar13 + 1;
      uVar9 = uVar8;
    }
    uVar8 = uVar8 << 0x10;
    uVar9 = uVar9 & 0xffff;
  }
  iVar5 = trex_newnode(exp,0x100);
  pTVar3 = exp->_nodes;
  pTVar3[iVar5].left = iVar4;
  pTVar3[iVar5].right = uVar8 | uVar9;
  bVar12 = *exp->_p;
  iVar4 = iVar5;
LAB_00126ffd:
  if (((0x2b < bVar12) || ((0xe0000000001U >> ((ulong)bVar12 & 0x3f) & 1) == 0)) && (bVar12 != 0x7c)
     ) {
    iVar5 = trex_element(exp);
    exp->_nodes[iVar4].next = iVar5;
  }
  return iVar4;
}

Assistant:

static int trex_element(TRex* exp) {
    int ret = -1;
    switch (*exp->_p) {
        case '(': {
            int expr, newn;
            exp->_p++;

            if (*exp->_p == '?') {
                exp->_p++;
                trex_expect(exp, ':');
                expr = trex_newnode(exp, OP_NOCAPEXPR);
            } else
                expr = trex_newnode(exp, OP_EXPR);
            newn = trex_list(exp);
            exp->_nodes[expr].left = newn;
            ret = expr;
            trex_expect(exp, ')');
        } break;
        case '[':
            exp->_p++;
            ret = trex_class(exp);
            trex_expect(exp, ']');
            break;
        case TREX_SYMBOL_END_OF_STRING:
            exp->_p++;
            ret = trex_newnode(exp, OP_EOL);
            break;
        case TREX_SYMBOL_ANY_CHAR:
            exp->_p++;
            ret = trex_newnode(exp, OP_DOT);
            break;
        default:
            ret = trex_charnode(exp, TRex_False);
            break;
    }

    {
        TRexBool isgreedy = TRex_False;
        unsigned short p0 = 0, p1 = 0;
        switch (*exp->_p) {
            case TREX_SYMBOL_GREEDY_ZERO_OR_MORE:
                p0 = 0;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ONE_OR_MORE:
                p0 = 1;
                p1 = 0xFFFF;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case TREX_SYMBOL_GREEDY_ZERO_OR_ONE:
                p0 = 0;
                p1 = 1;
                exp->_p++;
                isgreedy = TRex_True;
                break;
            case '{':
                exp->_p++;
                if (!isdigit((int)(*exp->_p)))
                    trex_error(exp, _SC("number expected"));
                p0 = (unsigned short)trex_parsenumber(exp);
                /*******************************/
                switch (*exp->_p) {
                    case '}':
                        p1 = p0;
                        exp->_p++;
                        break;
                    case ',':
                        exp->_p++;
                        p1 = 0xFFFF;
                        if (isdigit((int)(*exp->_p))) {
                            p1 = (unsigned short)trex_parsenumber(exp);
                        }
                        trex_expect(exp, '}');
                        break;
                    default:
                        trex_error(exp, _SC(", or } expected"));
                }
                /*******************************/
                isgreedy = TRex_True;
                break;
        }
        if (isgreedy) {
            int nnode = trex_newnode(exp, OP_GREEDY);
            exp->_nodes[nnode].left = ret;
            exp->_nodes[nnode].right = ((p0) << 16) | p1;
            ret = nnode;
        }
    }
    if ((*exp->_p != TREX_SYMBOL_BRANCH) && (*exp->_p != ')') && (*exp->_p != TREX_SYMBOL_GREEDY_ZERO_OR_MORE) &&
        (*exp->_p != TREX_SYMBOL_GREEDY_ONE_OR_MORE) && (*exp->_p != '\0')) {
        int nnode = trex_element(exp);
        exp->_nodes[ret].next = nnode;
    }

    return ret;
}